

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linf.c
# Opt level: O1

int linfwrt(lindef *lin,osfildef *fp)

{
  uint32_t tmp;
  int iVar1;
  size_t sVar2;
  uchar *__ptr;
  int iVar3;
  long lVar4;
  uchar buf [261];
  undefined1 local_138;
  undefined1 local_137;
  undefined4 local_136;
  undefined1 local_132 [266];
  
  local_138 = (undefined1)lin->linid;
  sVar2 = strlen((char *)&lin[2].linflg);
  iVar3 = 0;
  if (sVar2 < 0x100) {
    local_137 = (undefined1)sVar2;
    local_136 = *(undefined4 *)&lin[2].linbuf;
    memcpy(local_132,&lin[2].linflg,sVar2);
    sVar2 = fwrite(&local_138,sVar2 + 6,1,(FILE *)fp);
    if (sVar2 == 1) {
      iVar3 = 0;
      if ((lin[2].linbuf != (char *)0x0) &&
         (iVar1 = (int)((ulong)(lin[2].linbuf + -1) >> 10), iVar1 != -1)) {
        lVar4 = 0;
        do {
          __ptr = mcmlck((mcmcxdef *)lin[1].linofsp,*(mcmon *)((long)&lin[1].linrenp + lVar4 * 2));
          sVar2 = fwrite(__ptr,0x1000,1,(FILE *)fp);
          if (sVar2 != 1) goto LAB_00114d44;
          mcmunlck((mcmcxdef *)lin[1].linofsp,*(mcmon *)((long)&lin[1].linrenp + lVar4 * 2));
          lVar4 = lVar4 + 1;
        } while (iVar1 + 1 != (int)lVar4);
        iVar3 = 0;
      }
    }
    else {
LAB_00114d44:
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

int linfwrt(lindef *lin, osfildef *fp)
{
#   define  linf ((linfdef *)lin)
    uchar   buf[UCHAR_MAX + 6];
    size_t  len;
    uint    pgcnt;
    uchar  *objp;
    mcmon  *objn;

    buf[0] = lin->linid;
    len = strlen(linf->linfnam);
    if (len > UCHAR_MAX)
        return FALSE;
    buf[1] = (uchar)len;
    oswp4(buf + 2, linf->linfcrec);
    memcpy(buf + 6, linf->linfnam, (size_t)buf[1]);
    if (osfwb(fp, buf, (int)(buf[1] + 6))) return(TRUE);
    
    /* write the debug source pages */
    if (!linf->linfcrec) return(FALSE);          /* no debug records at all */
    pgcnt = 1 + ((linf->linfcrec - 1) >> 10);     /* figure number of pages */
    
    for (objn = linf->linfpg ; pgcnt ; ++objn, --pgcnt)
    {
        objp = mcmlck(linf->linfmem, *objn);
        if (osfwb(fp, objp, (1024 * DBGLINFSIZ))) return(TRUE);
        mcmunlck(linf->linfmem, *objn);
    }
    
    return(FALSE);

#   undef  linf
}